

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  slot_type *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined1 auVar9 [16];
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  undefined8 uVar25;
  ctrl_t *pcVar26;
  size_t i;
  ulong uVar27;
  ulong uVar28;
  byte bVar29;
  size_t i_00;
  FindInfo FVar30;
  
  uVar3 = this->capacity_;
  if (uVar3 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x1f2,"size_t phmap::priv::CapacityToGrowth(size_t)");
  }
  if (uVar3 - (uVar3 >> 3) >> 1 < this->size_) {
    resize(this,uVar3 * 2 + 1);
    return;
  }
  uVar3 = this->capacity_;
  if ((uVar3 == 0) || ((uVar3 + 1 & uVar3) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x76b,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>, phmap::priv::HashEq<vmips::VirtReg *>::Hash, phmap::priv::HashEq<vmips::VirtReg *>::Eq, std::allocator<std::shared_ptr<vmips::VirtReg>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>, Hash = phmap::priv::HashEq<vmips::VirtReg *>::Hash, Eq = phmap::priv::HashEq<vmips::VirtReg *>::Eq, Alloc = std::allocator<std::shared_ptr<vmips::VirtReg>>]"
                 );
  }
  if (uVar3 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x76c,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>, phmap::priv::HashEq<vmips::VirtReg *>::Hash, phmap::priv::HashEq<vmips::VirtReg *>::Eq, std::allocator<std::shared_ptr<vmips::VirtReg>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>, Hash = phmap::priv::HashEq<vmips::VirtReg *>::Hash, Eq = phmap::priv::HashEq<vmips::VirtReg *>::Eq, Alloc = std::allocator<std::shared_ptr<vmips::VirtReg>>]"
                 );
  }
  pcVar4 = this->ctrl_;
  if (pcVar4[uVar3] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x1da,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar26 = pcVar4 + uVar3;
  if (pcVar26 + 1 != pcVar4) {
    uVar28 = 0;
    do {
      pcVar1 = pcVar4 + uVar28;
      cVar10 = pcVar1[1];
      cVar11 = pcVar1[2];
      cVar12 = pcVar1[3];
      cVar13 = pcVar1[4];
      cVar14 = pcVar1[5];
      cVar15 = pcVar1[6];
      cVar16 = pcVar1[7];
      cVar17 = pcVar1[8];
      cVar18 = pcVar1[9];
      cVar19 = pcVar1[10];
      cVar20 = pcVar1[0xb];
      cVar21 = pcVar1[0xc];
      cVar22 = pcVar1[0xd];
      cVar23 = pcVar1[0xe];
      cVar24 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar4 + uVar28);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar23 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar24 < '\0') & 0x7eU ^ 0xfe;
      uVar28 = uVar28 + 0x10;
    } while (uVar3 + 1 != uVar28);
  }
  uVar25 = *(undefined8 *)(pcVar4 + 8);
  *(undefined8 *)(pcVar26 + 1) = *(undefined8 *)pcVar4;
  *(undefined8 *)(pcVar26 + 9) = uVar25;
  *pcVar26 = -1;
  if (this->capacity_ != 0) {
    i_00 = 0;
    do {
      if (this->ctrl_[i_00] == -2) {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = this->slots_[i_00].
                       super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar28 = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar9,8) +
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar9,0);
        FVar30 = find_first_non_full(this,uVar28);
        i = FVar30.offset;
        uVar3 = this->capacity_;
        if ((uVar3 + 1 & uVar3) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x55,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar27 = uVar28 >> 7 & uVar3;
        bVar29 = (byte)uVar28;
        if (((i_00 - uVar27 ^ i - uVar27) & uVar3) < 0x10) {
          bVar29 = bVar29 & 0x7f;
        }
        else {
          if (this->ctrl_[i] == -2) {
            set_ctrl(this,i,bVar29 & 0x7f);
            psVar5 = this->slots_;
            peVar7 = psVar5[i_00].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            p_Var6 = psVar5[i_00].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            psVar5[i_00].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            psVar5[i_00].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            psVar5 = this->slots_;
            psVar5[i_00].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 psVar5[i].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            psVar5[i_00].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var8 = psVar5[i].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            psVar5[i].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            psVar5[i_00].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = p_Var8;
            psVar5[i].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            p_Var8 = psVar5[i].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
            }
            psVar5 = this->slots_;
            psVar5[i].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7
            ;
            psVar5[i].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = p_Var6;
            i_00 = i_00 - 1;
            goto LAB_0011f40d;
          }
          if (this->ctrl_[i] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x79c,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>, phmap::priv::HashEq<vmips::VirtReg *>::Hash, phmap::priv::HashEq<vmips::VirtReg *>::Eq, std::allocator<std::shared_ptr<vmips::VirtReg>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>, Hash = phmap::priv::HashEq<vmips::VirtReg *>::Hash, Eq = phmap::priv::HashEq<vmips::VirtReg *>::Eq, Alloc = std::allocator<std::shared_ptr<vmips::VirtReg>>]"
                         );
          }
          set_ctrl(this,i,bVar29 & 0x7f);
          psVar5 = this->slots_;
          psVar5[i].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               psVar5[i_00].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          psVar5[i].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var6 = psVar5[i_00].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          psVar5[i_00].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          psVar5[i].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = p_Var6;
          psVar5[i_00].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          p_Var6 = psVar5[i_00].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          bVar29 = 0x80;
        }
        set_ctrl(this,i_00,bVar29);
      }
LAB_0011f40d:
      i_00 = i_00 + 1;
    } while (i_00 != this->capacity_);
  }
  reset_growth_left(this);
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }